

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::SplitProgramFromArgs(string *command,string *program,string *args)

{
  byte *pbVar1;
  char *pcVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte *__s;
  
  __s = (byte *)((command->_M_dataplus)._M_p + -1);
  do {
    pbVar1 = __s + 1;
    __s = __s + 1;
    iVar3 = isspace((uint)*pbVar1);
  } while (iVar3 != 0);
  bVar4 = *__s;
  if (bVar4 == 0) {
    bVar5 = true;
  }
  else {
    bVar6 = false;
    bVar7 = false;
    bVar5 = false;
    do {
      if (bVar6) {
        if (bVar4 != 0x27) goto LAB_00265a22;
        bVar6 = false;
      }
      else if (bVar5) {
        std::__cxx11::string::push_back((char)program);
        bVar5 = false;
      }
      else if (bVar4 == 0x5c) {
        bVar5 = true;
      }
      else if (bVar7) {
        if (bVar4 == 0x22) {
          bVar7 = false;
        }
        else {
LAB_00265a22:
          std::__cxx11::string::push_back((char)program);
        }
      }
      else if (bVar4 == 0x22) {
        bVar7 = true;
      }
      else {
        if (bVar4 != 0x27) {
          iVar3 = isspace((uint)bVar4);
          if (iVar3 == 0) goto LAB_00265a22;
          break;
        }
        bVar6 = true;
      }
      bVar4 = __s[1];
      __s = __s + 1;
    } while (bVar4 != 0);
    bVar5 = (bool)((bVar5 | bVar7 | bVar6) ^ 1);
  }
  pcVar2 = (char *)args->_M_string_length;
  strlen((char *)__s);
  std::__cxx11::string::_M_replace((ulong)args,0,pcVar2,(ulong)__s);
  return bVar5;
}

Assistant:

bool cmSystemTools::SplitProgramFromArgs(std::string const& command,
                                         std::string& program,
                                         std::string& args)
{
  const char* c = command.c_str();

  // Skip leading whitespace.
  while (isspace(static_cast<unsigned char>(*c))) {
    ++c;
  }

  // Parse one command-line element up to an unquoted space.
  bool in_escape = false;
  bool in_double = false;
  bool in_single = false;
  for (; *c; ++c) {
    if (in_single) {
      if (*c == '\'') {
        in_single = false;
      } else {
        program += *c;
      }
    } else if (in_escape) {
      in_escape = false;
      program += *c;
    } else if (*c == '\\') {
      in_escape = true;
    } else if (in_double) {
      if (*c == '"') {
        in_double = false;
      } else {
        program += *c;
      }
    } else if (*c == '"') {
      in_double = true;
    } else if (*c == '\'') {
      in_single = true;
    } else if (isspace(static_cast<unsigned char>(*c))) {
      break;
    } else {
      program += *c;
    }
  }

  // The remainder of the command line holds unparsed arguments.
  args = c;

  return !in_single && !in_escape && !in_double;
}